

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Reader::DoGetStructSync
          (BP5Reader *this,VariableStruct *variable,void *data)

{
  int iVar1;
  VariableBase *in_RDI;
  ScopedTimer __var21692;
  void *in_stack_ffffffffffffffb8;
  ScopedTimer *in_stack_ffffffffffffffc0;
  BP5Reader *in_stack_ffffffffffffffd0;
  
  if (DoGetStructSync(adios2::core::VariableStruct&,void*)::__var1692 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoGetStructSync(adios2::core::VariableStruct&,void*)::__var1692);
    if (iVar1 != 0) {
      DoGetStructSync::__var1692 = (void *)ps_timer_create_("BP5Reader::Get");
      in_stack_ffffffffffffffc0 = (ScopedTimer *)DoGetStructSync::__var1692;
      __cxa_guard_release(&DoGetStructSync(adios2::core::VariableStruct&,void*)::__var1692);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  GetSyncCommon(in_stack_ffffffffffffffd0,in_RDI,in_stack_ffffffffffffffc0);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void BP5Reader::DoGetStructSync(VariableStruct &variable, void *data)
{
    PERFSTUBS_SCOPED_TIMER("BP5Reader::Get");
    GetSyncCommon(variable, data);
}